

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

int actioncmp(action *ap1,action *ap2)

{
  int local_1c;
  int rc;
  action *ap2_local;
  action *ap1_local;
  
  local_1c = ap1->sp->index - ap2->sp->index;
  if (local_1c == 0) {
    local_1c = ap1->type - ap2->type;
  }
  if ((local_1c == 0) && ((ap1->type == REDUCE || (ap1->type == SHIFTREDUCE)))) {
    local_1c = ((ap1->x).rp)->index - ((ap2->x).rp)->index;
  }
  if (local_1c == 0) {
    local_1c = (int)(((long)ap2 - (long)ap1) / 0x30);
  }
  return local_1c;
}

Assistant:

static int actioncmp(ap1,ap2)
struct action *ap1;
struct action *ap2;
{
  int rc;
  rc = ap1->sp->index - ap2->sp->index;
  if( rc==0 ){
    rc = (int)ap1->type - (int)ap2->type;
  }
  if( rc==0 && (ap1->type==REDUCE || ap1->type==SHIFTREDUCE) ){
    rc = ap1->x.rp->index - ap2->x.rp->index;
  }
  if( rc==0 ){
    rc = ap2 - ap1;
  }
  return rc;
}